

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxReporters.cpp
# Opt level: O2

void __thiscall
ApprovalTests::Linux::SublimeMergeSnapReporter::SublimeMergeSnapReporter
          (SublimeMergeSnapReporter *this)

{
  DiffInfo DStack_58;
  
  DiffPrograms::Linux::SUBLIME_MERGE_SNAP();
  GenericDiffReporter::GenericDiffReporter(&this->super_GenericDiffReporter,&DStack_58);
  DiffInfo::~DiffInfo(&DStack_58);
  (this->super_GenericDiffReporter).super_CommandReporter.super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__GenericDiffReporter_00169eb0;
  SystemLauncher::setForeground(&(this->super_GenericDiffReporter).launcher,true);
  return;
}

Assistant:

SublimeMergeSnapReporter::SublimeMergeSnapReporter()
            : GenericDiffReporter(DiffPrograms::Linux::SUBLIME_MERGE_SNAP())
        {
            launcher.setForeground(true);
        }